

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

ConstraintBlockSyntax * __thiscall
slang::parsing::Parser::parseConstraintBlock(Parser *this,bool isTopLevel)

{
  Token closeBrace_00;
  Token openBrace_00;
  ConstraintBlockSyntax *pCVar1;
  SyntaxList<slang::syntax::ConstraintItemSyntax> local_98;
  size_type local_68;
  Info *local_60;
  anon_class_16_2_19c40af4 local_58;
  undefined1 local_48 [8];
  span<slang::syntax::ConstraintItemSyntax_*,_18446744073709551615UL> members;
  Token openBrace;
  Token closeBrace;
  bool isTopLevel_local;
  Parser *this_local;
  
  Token::Token((Token *)&openBrace.info);
  join_0x00000010_0x00000000_ = ParserBase::expect(&this->super_ParserBase,OpenBrace);
  local_58.this = this;
  local_58.isTopLevel = isTopLevel;
  _local_48 = parseMemberList<slang::syntax::ConstraintItemSyntax,slang::parsing::Parser::parseConstraintBlock(bool)::__0>
                        (this,CloseBrace,(Token *)&openBrace.info,ConstraintBlock,&local_58);
  local_68 = members.size_;
  local_60 = (Info *)openBrace._0_8_;
  slang::syntax::SyntaxList<slang::syntax::ConstraintItemSyntax>::SyntaxList(&local_98,_local_48);
  openBrace_00.info = local_60;
  openBrace_00.kind = (undefined2)local_68;
  openBrace_00._2_1_ = local_68._2_1_;
  openBrace_00.numFlags.raw = local_68._3_1_;
  openBrace_00.rawLen = local_68._4_4_;
  closeBrace_00.info = (Info *)closeBrace._0_8_;
  closeBrace_00._0_8_ = openBrace.info;
  pCVar1 = slang::syntax::SyntaxFactory::constraintBlock
                     (&this->factory,openBrace_00,&local_98,closeBrace_00);
  return pCVar1;
}

Assistant:

ConstraintBlockSyntax& Parser::parseConstraintBlock(bool isTopLevel) {
    Token closeBrace;
    auto openBrace = expect(TokenKind::OpenBrace);
    auto members = parseMemberList<ConstraintItemSyntax>(
        TokenKind::CloseBrace, closeBrace, SyntaxKind::ConstraintBlock,
        [this, isTopLevel](SyntaxKind, bool&) { return parseConstraintItem(false, isTopLevel); });

    return factory.constraintBlock(openBrace, members, closeBrace);
}